

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_make_filtration_non_decreasing_unit_test.cpp
# Opt level: O0

void __thiscall
make_filtration_non_decreasing<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>::
test_method(make_filtration_non_decreasing<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
            *this)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_9e8;
  basic_cstring<const_char> local_9d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9c8;
  assertion_result local_9a8;
  basic_cstring<const_char> local_990;
  basic_cstring<const_char> local_980;
  basic_cstring<const_char> local_970;
  basic_cstring<const_char> local_960;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_950;
  assertion_result local_930;
  basic_cstring<const_char> local_918;
  basic_cstring<const_char> local_908;
  undefined1 local_8f8 [8];
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> st_other_copy;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 *local_850;
  undefined8 local_848;
  undefined1 local_840 [40];
  size_t local_818;
  undefined1 local_810 [40];
  node_ptr local_7e8;
  undefined1 local_7e0 [40];
  undefined1 local_7b8 [40];
  size_holder<true,_unsigned_long,_void> local_790;
  undefined1 local_788 [24];
  basic_cstring<const_char> local_770;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_760;
  assertion_result local_740;
  basic_cstring<const_char> local_728;
  basic_cstring<const_char> local_718;
  basic_cstring<const_char> local_708;
  basic_cstring<const_char> local_6f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6e8;
  assertion_result local_6c8;
  basic_cstring<const_char> local_6b0;
  basic_cstring<const_char> local_6a0;
  Filtration_value local_690;
  undefined4 local_684;
  undefined4 *local_680;
  undefined8 local_678;
  undefined1 local_670 [24];
  size_type local_658;
  float local_650 [4];
  __node_base_ptr local_640;
  undefined8 local_638;
  undefined1 local_630 [32];
  float local_610;
  undefined4 local_60c;
  node_ptr local_608;
  __node_base_ptr local_600;
  undefined1 local_5f8 [28];
  undefined4 local_5dc;
  node_ptr local_5d8;
  node_ptr local_5d0;
  undefined1 local_5c8 [32];
  float local_5a8;
  undefined4 local_5a4;
  node_ptr local_5a0;
  node_ptr local_598;
  undefined1 local_590 [8];
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> st_other;
  basic_cstring<const_char> local_4f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4e0;
  assertion_result local_4c0;
  basic_cstring<const_char> local_4a8;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_468;
  assertion_result local_448;
  basic_cstring<const_char> local_430;
  basic_cstring<const_char> local_420;
  Filtration_value local_410;
  undefined4 local_408;
  undefined4 local_404;
  undefined4 *local_400;
  undefined8 local_3f8;
  undefined1 local_3f0 [48];
  __node_base_ptr local_3c0;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 *local_3a8;
  size_holder<true,_unsigned_long,_void> local_3a0;
  undefined1 local_398 [40];
  undefined1 local_370 [40];
  size_holder<true,_unsigned_long,_void> local_348;
  undefined1 local_340 [40];
  node_ptr local_318;
  undefined1 local_310 [16];
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> st_copy;
  basic_cstring<const_char> local_268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_258;
  assertion_result local_238;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  undefined1 local_200 [72];
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a8;
  assertion_result local_188;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  undefined1 local_150 [72];
  undefined8 local_108;
  compact_rbtree_node<void_*> local_100;
  undefined1 local_d8 [32];
  float local_b8;
  undefined4 local_b4;
  node_ptr local_b0;
  __node_base_ptr local_a8;
  undefined1 local_a0 [8];
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> st;
  make_filtration_non_decreasing<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
  *this_local;
  
  st._136_8_ = this;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  local_d8._28_4_ = 2;
  local_b8 = 1.4013e-45;
  local_b4 = 0;
  local_b0 = (node_ptr)(local_d8 + 0x1c);
  local_a8 = (__node_base_ptr)0x3;
  local_d8._16_8_ = (_Hash_node_base *)0x4000000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_d8,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_b0);
  local_100.parent_._0_4_ = 3;
  local_100.parent_._4_4_ = 0;
  local_100.left_ = &local_100;
  local_100.right_ = (node_ptr)0x2;
  local_108._0_4_ = 0;
  local_108._4_4_ = 0x40000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_150 + 0x38),
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_100.left_);
  local_150._28_4_ = 3;
  local_150._32_4_ = 5.60519e-45;
  local_150._36_4_ = 5;
  local_150._40_8_ = local_150 + 0x1c;
  local_150._48_8_ = (__node_base_ptr)0x3;
  local_150._16_8_ = (_Hash_node_base *)0x4000000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_150,
             (initializer_list<int> *)local_a0,(Filtration_value *)(local_150 + 0x28));
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "Check default insertion ensures the filtration values are non decreasing"
                          );
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_170);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_160,0x3c,&local_170);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
            make_filtration_non_decreasing
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_188,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,"!st.make_filtration_non_decreasing()",0x24);
    boost::unit_test::operator<<(&local_1a8,plVar4,&local_1b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_200 + 0x38),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion
              (&local_188,&local_1a8,local_200 + 0x38,0x3c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1a8);
    boost::test_tools::assertion_result::~assertion_result(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_200._24_4_ = 0;
  local_200._28_4_ = 1;
  local_200._32_4_ = 8.40779e-45;
  local_200._36_4_ = 7;
  local_200._40_8_ = local_200 + 0x18;
  local_200._48_8_ = (__node_base_ptr)0x4;
  local_200._16_8_ = (_Hash_node_base *)0x3ff0000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_200,
             (initializer_list<int> *)local_a0,(Filtration_value *)(local_200 + 0x28));
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "Check default second insertion ensures the filtration values are non decreasing"
                          );
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_220);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_210,0x4c,&local_220);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
            make_filtration_non_decreasing
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_238,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,"!st.make_filtration_non_decreasing()",0x24);
    boost::unit_test::operator<<(&local_258,plVar4,&local_268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&st_copy.dimension_,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion
              (&local_238,&local_258,&st_copy.dimension_,0x4c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_258);
    boost::test_tools::assertion_result::~assertion_result(&local_238);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_310 + 8),
             (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  local_340._16_4_ = 0;
  local_340._20_4_ = 1;
  local_340._24_4_ = 6;
  local_340._28_4_ = 7;
  local_340._32_8_ = local_340 + 0x10;
  local_318 = (node_ptr)0x4;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_310,
             (initializer_list<int> *)local_a0);
  local_340._8_8_ = (node_ptr)0x3fe999999999999a;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_310,(Filtration_value *)(local_340 + 8));
  local_370._20_4_ = 0;
  local_370._24_4_ = 1;
  local_370._28_4_ = 6;
  local_370._32_8_ = local_370 + 0x14;
  local_348.size_ = 3;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_340,
             (initializer_list<int> *)local_a0);
  local_370._8_8_ = (__node_base_ptr)0x3feccccccccccccd;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_340,(Filtration_value *)(local_370 + 8));
  local_398._16_4_ = 0;
  local_398._20_4_ = 6;
  local_398._24_8_ = local_398 + 0x10;
  local_398._32_8_ = (pointer)0x2;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_370,
             (initializer_list<int> *)local_a0);
  local_398._8_8_ = (node_ptr)0x3fe3333333333333;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_370,(Filtration_value *)(local_398 + 8));
  local_3b4 = 3;
  local_3b0 = 4;
  local_3ac = 5;
  local_3a8 = &local_3b4;
  local_3a0.size_ = 3;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_398,
             (initializer_list<int> *)local_a0);
  local_3c0 = (__node_base_ptr)0x3ff3333333333333;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_398,(Filtration_value *)&local_3c0);
  local_3f0._16_4_ = 3;
  local_3f0._20_4_ = 4;
  local_3f0._24_8_ = local_3f0 + 0x10;
  local_3f0._32_8_ = 2;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_3f0 + 0x28),
             (initializer_list<int> *)local_a0);
  local_3f0._8_8_ = 0x3ff199999999999a;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)(local_3f0 + 0x28),(Filtration_value *)(local_3f0 + 8));
  local_408 = 4;
  local_404 = 5;
  local_400 = &local_408;
  local_3f8 = 2;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_3f0,
             (initializer_list<int> *)local_a0);
  local_410 = 1.99;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_3f0,&local_410);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "Check the simplex_tree is rolled back in case of decreasing filtration values"
                          );
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_420,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_430);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_420,0x5a,&local_430);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
            make_filtration_non_decreasing
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_448,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,"st.make_filtration_non_decreasing()",0x23);
    boost::unit_test::operator<<(&local_468,plVar4,&local_478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion(&local_448,&local_468,&local_488,0x5a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_468);
    boost::test_tools::assertion_result::~assertion_result(&local_448);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_498,0x5b,&local_4a8);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::operator==
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
                       (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_310 + 8))
    ;
    boost::test_tools::assertion_result::assertion_result(&local_4c0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f0,"st == st_copy",0xd);
    boost::unit_test::operator<<(&local_4e0,plVar4,&local_4f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&st_other.dimension_,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion
              (&local_4c0,&local_4e0,&st_other.dimension_,0x5b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4e0);
    boost::test_tools::assertion_result::~assertion_result(&local_4c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_590);
  local_5c8._28_4_ = 2;
  local_5a8 = 1.4013e-45;
  local_5a4 = 0;
  local_5a0 = (node_ptr)(local_5c8 + 0x1c);
  local_598 = (node_ptr)0x3;
  local_5c8._16_8_ = (_Hash_node_base *)0x4008000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_5c8,
             (initializer_list<int> *)local_590,(Filtration_value *)&local_5a0);
  local_5f8._24_4_ = 3;
  local_5dc = 0;
  local_5d8 = (node_ptr)(local_5f8 + 0x18);
  local_5d0 = (node_ptr)0x2;
  local_5f8._16_8_ = (_Hash_node_base *)0x4000000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_5f8,
             (initializer_list<int> *)local_590,(Filtration_value *)&local_5d8);
  local_630._28_4_ = 3;
  local_610 = 5.60519e-45;
  local_60c = 5;
  local_608 = (node_ptr)(local_630 + 0x1c);
  local_600 = (__node_base_ptr)0x3;
  local_630._16_8_ = (_Hash_node_base *)0x4000000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_630,
             (initializer_list<int> *)local_590,(Filtration_value *)&local_608);
  local_650[0] = 0.0;
  local_650[1] = 1.4013e-45;
  local_650[2] = 8.40779e-45;
  local_650[3] = 9.80909e-45;
  local_640 = (__node_base_ptr)local_650;
  local_638._0_4_ = 4;
  local_638._4_4_ = 0;
  local_658 = 0x3ff0000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_670 + 8),
             (initializer_list<int> *)local_590,(Filtration_value *)&local_640);
  local_684 = 2;
  local_680 = &local_684;
  local_678 = 1;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_670,
             (initializer_list<int> *)local_a0);
  local_690 = 3.0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_670,&local_690);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "Check the simplex_tree is repaired in case of decreasing filtration values"
                          );
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6a0,0x6a,&local_6b0);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
            make_filtration_non_decreasing
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_6c8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f8,"st.make_filtration_non_decreasing()",0x23);
    boost::unit_test::operator<<(&local_6e8,plVar4,&local_6f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_708,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion(&local_6c8,&local_6e8,&local_708,0x6a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6e8);
    boost::test_tools::assertion_result::~assertion_result(&local_6c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_718,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_728);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_718,0x6b,&local_728);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::operator==
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
                       (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_590);
    boost::test_tools::assertion_result::assertion_result(&local_740,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_770,"st == st_other",0xe);
    boost::unit_test::operator<<(&local_760,plVar4,&local_770);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_788 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion(&local_740,&local_760,local_788 + 8,0x6b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_760);
    boost::test_tools::assertion_result::~assertion_result(&local_740);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_7b8._20_4_ = 0;
  local_7b8._24_4_ = 1;
  local_7b8._28_4_ = 2;
  local_7b8._32_8_ = local_7b8 + 0x14;
  local_790.size_ = 3;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_788,
             (initializer_list<int> *)local_a0);
  local_7b8._8_8_ = (__node_base_ptr)0x4024000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_788,(Filtration_value *)(local_7b8 + 8));
  local_7e0._16_4_ = 0;
  local_7e0._20_4_ = 2;
  local_7e0._24_8_ = local_7e0 + 0x10;
  local_7e0._32_8_ = (pointer)0x2;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_7b8,
             (initializer_list<int> *)local_a0);
  local_7e0._8_8_ = (node_ptr)0x4022000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_7b8,(Filtration_value *)(local_7e0 + 8));
  local_810._16_4_ = 0;
  local_810._20_4_ = 1;
  local_810._24_4_ = 6;
  local_810._28_4_ = 7;
  local_810._32_8_ = local_810 + 0x10;
  local_7e8 = (node_ptr)0x4;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_7e0,
             (initializer_list<int> *)local_a0);
  local_810._8_8_ = 0x4049000000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_7e0,(Filtration_value *)(local_810 + 8));
  local_840._20_4_ = 0;
  local_840._24_4_ = 1;
  local_840._28_4_ = 6;
  local_840._32_8_ = local_840 + 0x14;
  local_818 = 3;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_840 + 0x30),
             (initializer_list<int> *)local_a0);
  local_840._8_8_ = 0x4048800000000000;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)(local_840 + 0x30),(Filtration_value *)(local_840 + 8));
  local_85c = 0;
  local_858 = 1;
  local_854 = 7;
  local_850 = &local_85c;
  local_848 = 3;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_840,
             (initializer_list<int> *)local_a0);
  st_other_copy.dimension_ = 0;
  st_other_copy.dimension_to_be_lowered_ = false;
  st_other_copy._141_3_ = 0x404800;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_840,(Filtration_value *)&st_other_copy.dimension_);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_8f8,
             (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "Check the simplex_tree is not modified in case of non-decreasing filtration values"
                          );
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_908,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_918);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_908,0x77,&local_918);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
            make_filtration_non_decreasing
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_930,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_960,"!st.make_filtration_non_decreasing()",0x24);
    boost::unit_test::operator<<(&local_950,plVar4,&local_960);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_970,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion(&local_930,&local_950,&local_970,0x77,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_950);
    boost::test_tools::assertion_result::~assertion_result(&local_930);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_980,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_990);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_980,0x78,&local_990);
    bVar2 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::operator==
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
                       (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_8f8);
    boost::test_tools::assertion_result::assertion_result(&local_9a8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d8,"st == st_other_copy",0x13);
    boost::unit_test::operator<<(&local_9c8,plVar4,&local_9d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion(&local_9a8,&local_9c8,&local_9e8,0x78,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9c8);
    boost::test_tools::assertion_result::~assertion_result(&local_9a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::~Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_8f8);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::~Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_590);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::~Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_310 + 8));
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::~Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(make_filtration_non_decreasing, typeST, list_of_tested_variants) {
  typeST st;

  st.insert_simplex_and_subfaces({2, 1, 0}, 2.0);
  st.insert_simplex_and_subfaces({3, 0}, 2.0);
  st.insert_simplex_and_subfaces({3, 4, 5}, 2.0);
  
  /* Inserted simplex:     */
  /*    1                  */
  /*    o                  */
  /*   /X\                 */
  /*  o---o---o---o        */
  /*  2   0   3\X/4        */
  /*            o          */
  /*            5          */

  std::clog << "Check default insertion ensures the filtration values are non decreasing" << std::endl;
  BOOST_CHECK(!st.make_filtration_non_decreasing());

  // Because of non decreasing property of simplex tree, { 0 } , { 1 } and { 0, 1 } are going to be set from value 2.0
  // to 1.0
  st.insert_simplex_and_subfaces({0, 1, 6, 7}, 1.0);
  
  // Inserted simplex:
  //    1   6
  //    o---o
  //   /X\7/
  //  o---o---o---o
  //  2   0   3\X/4
  //            o
  //            5
  
  std::clog << "Check default second insertion ensures the filtration values are non decreasing" << std::endl;
  BOOST_CHECK(!st.make_filtration_non_decreasing());
  
  // Copy original simplex tree
  typeST st_copy = st;

  // Modify specific values for st to become like st_copy thanks to make_filtration_non_decreasing
  st.assign_filtration(st.find({0,1,6,7}), 0.8);
  st.assign_filtration(st.find({0,1,6}), 0.9);
  st.assign_filtration(st.find({0,6}), 0.6);
  st.assign_filtration(st.find({3,4,5}), 1.2);
  st.assign_filtration(st.find({3,4}), 1.1);
  st.assign_filtration(st.find({4,5}), 1.99);
  
  std::clog << "Check the simplex_tree is rolled back in case of decreasing filtration values" << std::endl;
  BOOST_CHECK(st.make_filtration_non_decreasing());
  BOOST_CHECK(st == st_copy);

  // Other simplex tree
  typeST st_other;
  st_other.insert_simplex_and_subfaces({2, 1, 0}, 3.0);  // This one is different from st
  st_other.insert_simplex_and_subfaces({3, 0}, 2.0);
  st_other.insert_simplex_and_subfaces({3, 4, 5}, 2.0);
  st_other.insert_simplex_and_subfaces({0, 1, 6, 7}, 1.0);

  // Modify specific values for st to become like st_other thanks to make_filtration_non_decreasing
  st.assign_filtration(st.find({2}), 3.0);
  // By modifying just the simplex {2}
  // {0,1,2}, {1,2} and {0,2} will be modified
  
  std::clog << "Check the simplex_tree is repaired in case of decreasing filtration values" << std::endl;
  BOOST_CHECK(st.make_filtration_non_decreasing());
  BOOST_CHECK(st == st_other);

  // Modify specific values for st still to be non-decreasing
  st.assign_filtration(st.find({0,1,2}), 10.0);
  st.assign_filtration(st.find({0,2}), 9.0);
  st.assign_filtration(st.find({0,1,6,7}), 50.0);
  st.assign_filtration(st.find({0,1,6}), 49.0);
  st.assign_filtration(st.find({0,1,7}), 48.0);
  // Other copy simplex tree
  typeST st_other_copy = st;
  
  std::clog << "Check the simplex_tree is not modified in case of non-decreasing filtration values" << std::endl;
  BOOST_CHECK(!st.make_filtration_non_decreasing());
  BOOST_CHECK(st == st_other_copy);
  
}